

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp analyze_var_ref(sexp ctx,sexp x,sexp_conflict *varenv)

{
  sexp_tag_t sVar1;
  double dVar2;
  sexp psVar3;
  sexp psVar4;
  sexp cell;
  sexp local_48;
  sexp_gc_var_t local_40;
  
  local_40.var = &local_48;
  psVar4 = (ctx->value).type.cpl;
  local_48 = (sexp)0x43e;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  psVar3 = sexp_env_cell_loc(ctx,psVar4,x,0,varenv);
  if ((psVar3 == (sexp)0x0) &&
     (local_48 = psVar3, psVar3 = sexp_env_cell_loc(ctx,psVar4,x,0,varenv), psVar3 == (sexp)0x0)) {
    psVar3 = sexp_env_cell_define(ctx,psVar4,x,(sexp)&DAT_0000053e,varenv);
  }
  psVar4 = (psVar3->value).type.cpl;
  local_48 = psVar3;
  if ((((ulong)psVar4 & 3) == 0) && ((sVar1 = psVar4->tag, sVar1 == 0x19 || (sVar1 == 0x15)))) {
    psVar4 = sexp_compile_error(ctx,"invalid use of syntax as value",x);
  }
  else {
    dVar2 = (psVar3->value).flonum;
    psVar4 = sexp_alloc_tagged_aux(ctx,0x20,0x1e);
    (psVar4->value).flonum = dVar2;
    (psVar4->value).type.cpl = psVar3;
  }
  (ctx->value).context.saves = local_40.next;
  return psVar4;
}

Assistant:

static sexp analyze_var_ref (sexp ctx, sexp x, sexp *varenv) {
  sexp env = sexp_context_env(ctx), res;
  sexp_gc_var1(cell);
  sexp_gc_preserve1(ctx, cell);
  cell = sexp_env_cell_loc(ctx, env, x, 0, varenv);
  if (! cell) {
    cell = sexp_env_cell_create(ctx, env, x, SEXP_UNDEF, varenv);
  }
  if (sexp_macrop(sexp_cdr(cell)) || sexp_corep(sexp_cdr(cell))) {
    res = sexp_compile_error(ctx, "invalid use of syntax as value", x);
  } else {
    res = sexp_make_ref(ctx, sexp_car(cell), cell);
  }
  sexp_gc_release1(ctx);
  return res;
}